

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O2

void initPyData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  initializer_list<std::pair<char,_QLatin1String>_> list_02;
  QMultiHash<char,_QLatin1String> QStack_7d8;
  pair<char,_QLatin1String> local_7c8;
  undefined1 local_7b0;
  undefined8 local_7a8;
  char *local_7a0;
  undefined1 local_798;
  undefined8 local_790;
  char *local_788;
  undefined1 local_780;
  undefined8 local_778;
  char *local_770;
  undefined1 local_768;
  undefined8 local_760;
  char *local_758;
  undefined1 local_750;
  undefined8 local_748;
  char *local_740;
  undefined1 local_738;
  undefined8 local_730;
  char *local_728;
  undefined1 local_720;
  undefined8 local_718;
  char *local_710;
  undefined1 local_708;
  undefined8 local_700;
  char *local_6f8;
  undefined1 local_6f0;
  undefined8 local_6e8;
  char *local_6e0;
  undefined1 local_6d8;
  undefined8 local_6d0;
  char *local_6c8;
  undefined1 local_6c0;
  undefined8 local_6b8;
  char *local_6b0;
  undefined1 local_6a8;
  undefined8 local_6a0;
  char *local_698;
  undefined1 local_690;
  undefined8 local_688;
  char *local_680;
  undefined1 local_678;
  undefined8 local_670;
  char *local_668;
  undefined1 local_660;
  undefined8 local_658;
  char *local_650;
  undefined1 local_648;
  undefined8 local_640;
  char *local_638;
  undefined1 local_630;
  undefined8 local_628;
  char *local_620;
  undefined1 local_618;
  undefined8 local_610;
  char *local_608;
  undefined1 local_600;
  undefined8 local_5f8;
  char *local_5f0;
  undefined1 local_5e8;
  undefined8 local_5e0;
  char *local_5d8;
  undefined1 local_5d0;
  undefined8 local_5c8;
  char *local_5c0;
  undefined1 local_5b8;
  undefined8 local_5b0;
  char *local_5a8;
  undefined1 local_5a0;
  undefined8 local_598;
  char *local_590;
  undefined1 local_588;
  undefined8 local_580;
  char *local_578;
  undefined1 local_570;
  undefined8 local_568;
  char *local_560;
  undefined1 local_558;
  undefined8 local_550;
  char *local_548;
  undefined1 local_540;
  undefined8 local_538;
  char *local_530;
  undefined1 local_528;
  undefined8 local_520;
  char *local_518;
  undefined1 local_510;
  undefined8 local_508;
  char *local_500;
  undefined1 local_4f8;
  undefined8 local_4f0;
  char *local_4e8;
  undefined1 local_4e0;
  undefined8 local_4d8;
  char *local_4d0;
  undefined1 local_4c8;
  undefined8 local_4c0;
  char *local_4b8;
  undefined1 local_4b0;
  undefined8 local_4a8;
  char *local_4a0;
  undefined1 local_498;
  undefined8 local_490;
  char *local_488;
  undefined1 local_480;
  undefined8 local_478;
  char *local_470;
  undefined1 local_468;
  undefined8 local_460;
  char *local_458;
  undefined1 local_450;
  undefined8 local_448;
  char *local_440;
  undefined1 local_438;
  undefined8 local_430;
  char *local_428;
  undefined1 local_420;
  undefined8 local_418;
  char *local_410;
  undefined1 local_408;
  undefined8 local_400;
  char *local_3f8;
  undefined1 local_3f0;
  undefined8 local_3e8;
  char *local_3e0;
  undefined1 local_3d8;
  undefined8 local_3d0;
  char *local_3c8;
  undefined1 local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  undefined1 local_3a8;
  undefined8 local_3a0;
  char *local_398;
  undefined1 local_390;
  undefined8 local_388;
  char *local_380;
  undefined1 local_378;
  undefined8 local_370;
  char *local_368;
  undefined1 local_360;
  undefined8 local_358;
  char *local_350;
  undefined1 local_348;
  undefined8 local_340;
  char *local_338;
  undefined1 local_330;
  undefined8 local_328;
  char *local_320;
  undefined1 local_318;
  undefined8 local_310;
  char *local_308;
  undefined1 local_300;
  undefined8 local_2f8;
  char *local_2f0;
  undefined1 local_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  undefined1 local_2d0;
  undefined8 local_2c8;
  char *local_2c0;
  undefined1 local_2b8;
  undefined8 local_2b0;
  char *local_2a8;
  undefined1 local_2a0;
  undefined8 local_298;
  char *local_290;
  undefined1 local_288;
  undefined8 local_280;
  char *local_278;
  undefined1 local_270;
  undefined8 local_268;
  char *local_260;
  undefined1 local_258;
  undefined8 local_250;
  char *local_248;
  undefined1 local_240;
  undefined8 local_238;
  char *local_230;
  undefined1 local_228;
  undefined8 local_220;
  char *local_218;
  undefined1 local_210;
  undefined8 local_208;
  char *local_200;
  undefined1 local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  undefined1 local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  undefined1 local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined1 local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined1 local_198;
  undefined8 local_190;
  char *local_188;
  undefined1 local_180;
  undefined8 local_178;
  char *local_170;
  undefined1 local_168;
  undefined8 local_160;
  char *local_158;
  undefined1 local_150;
  undefined8 local_148;
  char *local_140;
  undefined1 local_138;
  undefined8 local_130;
  char *local_128;
  undefined1 local_120;
  undefined8 local_118;
  char *local_110;
  undefined1 local_108;
  undefined8 local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined1 local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined1 local_c0;
  undefined8 local_b8;
  char *local_b0;
  undefined1 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined1 local_90;
  undefined8 local_88;
  char *local_80;
  undefined1 local_78;
  undefined8 local_70;
  char *local_68;
  undefined1 local_60;
  undefined8 local_58;
  char *local_50;
  undefined1 local_48;
  undefined8 local_40;
  char *local_38;
  
  local_7c8.first = 'a';
  local_7c8.second.m_size = 3;
  local_7c8.second.m_data = "and";
  local_7b0 = 0x65;
  local_7a8 = 4;
  local_7a0 = "elif";
  local_798 = 0x69;
  local_790 = 2;
  local_788 = "is";
  local_780 = 0x67;
  local_778 = 6;
  local_770 = "global";
  local_768 = 0x61;
  local_760 = 2;
  local_758 = "as";
  local_750 = 0x69;
  local_748 = 2;
  local_740 = "in";
  local_738 = 0x69;
  local_730 = 2;
  local_728 = "if";
  local_720 = 0x66;
  local_718 = 4;
  local_710 = "from";
  local_708 = 0x72;
  local_700 = 5;
  local_6f8 = "raise";
  local_6f0 = 0x66;
  local_6e8 = 3;
  local_6e0 = "for";
  local_6d8 = 0x65;
  local_6d0 = 6;
  local_6c8 = "except";
  local_6c0 = 0x66;
  local_6b8 = 7;
  local_6b0 = "finally";
  local_6a8 = 0x70;
  local_6a0 = 5;
  local_698 = "print";
  local_690 = 0x70;
  local_688 = 4;
  local_680 = "pass";
  local_678 = 0x72;
  local_670 = 6;
  local_668 = "return";
  local_660 = 0x65;
  local_658 = 4;
  local_650 = "exec";
  local_648 = 0x65;
  local_640 = 4;
  local_638 = "else";
  local_630 = 0x62;
  local_628 = 5;
  local_620 = "break";
  local_618 = 0x6e;
  local_610 = 3;
  local_608 = "not";
  local_600 = 0x77;
  local_5f8 = 4;
  local_5f0 = "with";
  local_5e8 = 99;
  local_5e0 = 5;
  local_5d8 = "class";
  local_5d0 = 0x61;
  local_5c8 = 6;
  local_5c0 = "assert";
  local_5b8 = 0x79;
  local_5b0 = 5;
  local_5a8 = "yield";
  local_5a0 = 0x74;
  local_598 = 3;
  local_590 = "try";
  local_588 = 0x77;
  local_580 = 5;
  local_578 = "while";
  local_570 = 99;
  local_568 = 8;
  local_560 = "continue";
  local_558 = 100;
  local_550 = 3;
  local_548 = "del";
  local_540 = 0x6f;
  local_538 = 2;
  local_530 = "or";
  local_528 = 100;
  local_520 = 3;
  local_518 = "def";
  local_510 = 0x6c;
  local_508 = 6;
  local_500 = "lambda";
  local_4f8 = 0x61;
  local_4f0 = 5;
  local_4e8 = "async";
  local_4e0 = 0x61;
  local_4d8 = 5;
  local_4d0 = "await";
  local_4c8 = 0x6e;
  local_4c0 = 8;
  local_4b8 = "nonlocal";
  list._M_len = 0x21;
  list._M_array = &local_7c8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_7d8,list);
  QMultiHash<char,_QLatin1String>::operator=(&py_keywords,&QStack_7d8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_7d8);
  local_7c8.first = '\0';
  local_7c8._1_7_ = 0;
  local_7c8.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&py_types,(QMultiHash<char,_QLatin1String> *)&local_7c8);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_7c8);
  local_7c8.first = 'F';
  local_7c8.second.m_size = 5;
  local_7c8.second.m_data = "False";
  local_7b0 = 0x54;
  local_7a8 = 4;
  local_7a0 = "True";
  local_798 = 0x4e;
  local_790 = 4;
  local_788 = "None";
  list_00._M_len = 3;
  list_00._M_array = &local_7c8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_7d8,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&py_literals,&QStack_7d8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_7d8);
  local_7c8.first = '_';
  local_7c8.second.m_size = 10;
  local_7c8.second.m_data = "__import__";
  local_7b0 = 0x61;
  local_7a8 = 3;
  local_7a0 = "abs";
  local_798 = 0x61;
  local_790 = 3;
  local_788 = "all";
  local_780 = 0x61;
  local_778 = 3;
  local_770 = "any";
  local_768 = 0x61;
  local_760 = 5;
  local_758 = "apply";
  local_750 = 0x61;
  local_748 = 5;
  local_740 = "ascii";
  local_738 = 0x62;
  local_730 = 10;
  local_728 = "basestring";
  local_720 = 0x62;
  local_718 = 3;
  local_710 = "bin";
  local_708 = 0x62;
  local_700 = 4;
  local_6f8 = "bool";
  local_6f0 = 0x62;
  local_6e8 = 6;
  local_6e0 = "buffer";
  local_6d8 = 0x62;
  local_6d0 = 9;
  local_6c8 = "bytearray";
  local_6c0 = 0x62;
  local_6b8 = 5;
  local_6b0 = "bytes";
  local_6a8 = 99;
  local_6a0 = 8;
  local_698 = "callable";
  local_690 = 99;
  local_688 = 3;
  local_680 = "chr";
  local_678 = 99;
  local_670 = 0xb;
  local_668 = "classmethod";
  local_660 = 99;
  local_658 = 3;
  local_650 = "cmp";
  local_648 = 99;
  local_640 = 6;
  local_638 = "coerce";
  local_630 = 99;
  local_628 = 7;
  local_620 = "compile";
  local_618 = 99;
  local_610 = 7;
  local_608 = "complex";
  local_600 = 100;
  local_5f8 = 7;
  local_5f0 = "delattr";
  local_5e8 = 100;
  local_5e0 = 4;
  local_5d8 = "dict";
  local_5d0 = 100;
  local_5c8 = 3;
  local_5c0 = "dir";
  local_5b8 = 100;
  local_5b0 = 6;
  local_5a8 = "divmod";
  local_5a0 = 0x65;
  local_598 = 9;
  local_590 = "enumerate";
  local_588 = 0x65;
  local_580 = 4;
  local_578 = "eval";
  local_570 = 0x65;
  local_568 = 8;
  local_560 = "execfile";
  local_558 = 0x66;
  local_550 = 4;
  local_548 = "file";
  local_540 = 0x66;
  local_538 = 6;
  local_530 = "filter";
  local_528 = 0x66;
  local_520 = 5;
  local_518 = "float";
  local_510 = 0x66;
  local_508 = 6;
  local_500 = "format";
  local_4f8 = 0x66;
  local_4f0 = 9;
  local_4e8 = "frozenset";
  local_4e0 = 0x67;
  local_4d8 = 7;
  local_4d0 = "getattr";
  local_4c8 = 0x67;
  local_4c0 = 7;
  local_4b8 = "globals";
  local_4b0 = 0x68;
  local_4a8 = 7;
  local_4a0 = "hasattr";
  local_498 = 0x68;
  local_490 = 4;
  local_488 = "hash";
  local_480 = 0x68;
  local_478 = 4;
  local_470 = "help";
  local_468 = 0x68;
  local_460 = 3;
  local_458 = "hex";
  local_450 = 0x69;
  local_448 = 2;
  local_440 = "id";
  local_438 = 0x69;
  local_430 = 5;
  local_428 = "input";
  local_420 = 0x69;
  local_418 = 3;
  local_410 = "int";
  local_408 = 0x69;
  local_400 = 6;
  local_3f8 = "intern";
  local_3f0 = 0x69;
  local_3e8 = 10;
  local_3e0 = "isinstance";
  local_3d8 = 0x69;
  local_3d0 = 10;
  local_3c8 = "issubclass";
  local_3c0 = 0x69;
  local_3b8 = 4;
  local_3b0 = "iter";
  local_3a8 = 0x6c;
  local_3a0 = 3;
  local_398 = "len";
  local_390 = 0x6c;
  local_388 = 4;
  local_380 = "list";
  local_378 = 0x6c;
  local_370 = 6;
  local_368 = "locals";
  local_360 = 0x6c;
  local_358 = 4;
  local_350 = "long";
  local_348 = 0x6d;
  local_340 = 3;
  local_338 = "map";
  local_330 = 0x6d;
  local_328 = 3;
  local_320 = "max";
  local_318 = 0x6d;
  local_310 = 10;
  local_308 = "memoryview";
  local_300 = 0x6d;
  local_2f8 = 3;
  local_2f0 = "min";
  local_2e8 = 0x6e;
  local_2e0 = 4;
  local_2d8 = "next";
  local_2d0 = 0x6f;
  local_2c8 = 6;
  local_2c0 = "object";
  local_2b8 = 0x6f;
  local_2b0 = 3;
  local_2a8 = "oct";
  local_2a0 = 0x6f;
  local_298 = 4;
  local_290 = "open";
  local_288 = 0x6f;
  local_280 = 3;
  local_278 = "ord";
  local_270 = 0x70;
  local_268 = 3;
  local_260 = "pow";
  local_258 = 0x70;
  local_250 = 8;
  local_248 = "property";
  local_240 = 0x72;
  local_238 = 5;
  local_230 = "range";
  local_228 = 0x72;
  local_220 = 9;
  local_218 = "raw_input";
  local_210 = 0x72;
  local_208 = 6;
  local_200 = "reduce";
  local_1f8 = 0x72;
  local_1f0 = 6;
  local_1e8 = "reload";
  local_1e0 = 0x72;
  local_1d8 = 4;
  local_1d0 = "repr";
  local_1c8 = 0x72;
  local_1c0 = 8;
  local_1b8 = "reversed";
  local_1b0 = 0x72;
  local_1a8 = 5;
  local_1a0 = "round";
  local_198 = 0x73;
  local_190 = 3;
  local_188 = "set";
  local_180 = 0x73;
  local_178 = 7;
  local_170 = "setattr";
  local_168 = 0x73;
  local_160 = 5;
  local_158 = "slice";
  local_150 = 0x73;
  local_148 = 6;
  local_140 = "sorted";
  local_138 = 0x73;
  local_130 = 0xc;
  local_128 = "staticmethod";
  local_120 = 0x73;
  local_118 = 3;
  local_110 = "str";
  local_108 = 0x73;
  local_100 = 3;
  local_f8 = "sum";
  local_f0 = 0x73;
  local_e8 = 5;
  local_e0 = "super";
  local_d8 = 0x74;
  local_d0 = 5;
  local_c8 = "tuple";
  local_c0 = 0x74;
  local_b8 = 4;
  local_b0 = "type";
  local_a8 = 0x75;
  local_a0 = 6;
  local_98 = "unichr";
  local_90 = 0x75;
  local_88 = 7;
  local_80 = "unicode";
  local_78 = 0x76;
  local_70 = 4;
  local_68 = "vars";
  local_60 = 0x78;
  local_58 = 6;
  local_50 = "xrange";
  local_48 = 0x7a;
  local_40 = 3;
  local_38 = "zip";
  list_01._M_len = 0x51;
  list_01._M_array = &local_7c8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_7d8,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&py_builtin,&QStack_7d8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_7d8);
  local_7c8.first = 'i';
  local_7c8.second.m_size = 6;
  local_7c8.second.m_data = "import";
  list_02._M_len = 1;
  list_02._M_array = &local_7c8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_7d8,list_02);
  QMultiHash<char,_QLatin1String>::operator=(&py_other,&QStack_7d8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_7d8);
  return;
}

Assistant:

void initPyData() {
    py_keywords = {
        {('a'), QLatin1String("and")},      {('e'), QLatin1String("elif")},
        {('i'), QLatin1String("is")},       {('g'), QLatin1String("global")},
        {('a'), QLatin1String("as")},       {('i'), QLatin1String("in")},
        {('i'), QLatin1String("if")},       {('f'), QLatin1String("from")},
        {('r'), QLatin1String("raise")},    {('f'), QLatin1String("for")},
        {('e'), QLatin1String("except")},   {('f'), QLatin1String("finally")},
        {('p'), QLatin1String("print")},    {('p'), QLatin1String("pass")},
        {('r'), QLatin1String("return")},   {('e'), QLatin1String("exec")},
        {('e'), QLatin1String("else")},     {('b'), QLatin1String("break")},
        {('n'), QLatin1String("not")},      {('w'), QLatin1String("with")},
        {('c'), QLatin1String("class")},    {('a'), QLatin1String("assert")},
        {('y'), QLatin1String("yield")},    {('t'), QLatin1String("try")},
        {('w'), QLatin1String("while")},    {('c'), QLatin1String("continue")},
        {('d'), QLatin1String("del")},      {('o'), QLatin1String("or")},
        {('d'), QLatin1String("def")},      {('l'), QLatin1String("lambda")},
        {('a'), QLatin1String("async")},    {('a'), QLatin1String("await")},
        {('n'), QLatin1String("nonlocal")},
    };

    py_types = {

    };

    py_literals = {{('F'), QLatin1String("False")},
                   {('T'), QLatin1String("True")},
                   {('N'), QLatin1String("None")}};

    py_builtin = {{('_'), QLatin1String("__import__")},
                  {('a'), QLatin1String("abs")},
                  {('a'), QLatin1String("all")},
                  {('a'), QLatin1String("any")},
                  {('a'), QLatin1String("apply")},
                  {('a'), QLatin1String("ascii")},
                  {('b'), QLatin1String("basestring")},
                  {('b'), QLatin1String("bin")},
                  {('b'), QLatin1String("bool")},
                  {('b'), QLatin1String("buffer")},
                  {('b'), QLatin1String("bytearray")},
                  {('b'), QLatin1String("bytes")},
                  {('c'), QLatin1String("callable")},
                  {('c'), QLatin1String("chr")},
                  {('c'), QLatin1String("classmethod")},
                  {('c'), QLatin1String("cmp")},
                  {('c'), QLatin1String("coerce")},
                  {('c'), QLatin1String("compile")},
                  {('c'), QLatin1String("complex")},
                  {('d'), QLatin1String("delattr")},
                  {('d'), QLatin1String("dict")},
                  {('d'), QLatin1String("dir")},
                  {('d'), QLatin1String("divmod")},
                  {('e'), QLatin1String("enumerate")},
                  {('e'), QLatin1String("eval")},
                  {('e'), QLatin1String("execfile")},
                  {('f'), QLatin1String("file")},
                  {('f'), QLatin1String("filter")},
                  {('f'), QLatin1String("float")},
                  {('f'), QLatin1String("format")},
                  {('f'), QLatin1String("frozenset")},
                  {('g'), QLatin1String("getattr")},
                  {('g'), QLatin1String("globals")},
                  {('h'), QLatin1String("hasattr")},
                  {('h'), QLatin1String("hash")},
                  {('h'), QLatin1String("help")},
                  {('h'), QLatin1String("hex")},
                  {('i'), QLatin1String("id")},
                  {('i'), QLatin1String("input")},
                  {('i'), QLatin1String("int")},
                  {('i'), QLatin1String("intern")},
                  {('i'), QLatin1String("isinstance")},
                  {('i'), QLatin1String("issubclass")},
                  {('i'), QLatin1String("iter")},
                  {('l'), QLatin1String("len")},
                  {('l'), QLatin1String("list")},
                  {('l'), QLatin1String("locals")},
                  {('l'), QLatin1String("long")},
                  {('m'), QLatin1String("map")},
                  {('m'), QLatin1String("max")},
                  {('m'), QLatin1String("memoryview")},
                  {('m'), QLatin1String("min")},
                  {('n'), QLatin1String("next")},
                  {('o'), QLatin1String("object")},
                  {('o'), QLatin1String("oct")},
                  {('o'), QLatin1String("open")},
                  {('o'), QLatin1String("ord")},
                  {('p'), QLatin1String("pow")},
                  {('p'), QLatin1String("property")},
                  {('r'), QLatin1String("range")},
                  {('r'), QLatin1String("raw_input")},
                  {('r'), QLatin1String("reduce")},
                  {('r'), QLatin1String("reload")},
                  {('r'), QLatin1String("repr")},
                  {('r'), QLatin1String("reversed")},
                  {('r'), QLatin1String("round")},
                  {('s'), QLatin1String("set")},
                  {('s'), QLatin1String("setattr")},
                  {('s'), QLatin1String("slice")},
                  {('s'), QLatin1String("sorted")},
                  {('s'), QLatin1String("staticmethod")},
                  {('s'), QLatin1String("str")},
                  {('s'), QLatin1String("sum")},
                  {('s'), QLatin1String("super")},
                  {('t'), QLatin1String("tuple")},
                  {('t'), QLatin1String("type")},
                  {('u'), QLatin1String("unichr")},
                  {('u'), QLatin1String("unicode")},
                  {('v'), QLatin1String("vars")},
                  {('x'), QLatin1String("xrange")},
                  {('z'), QLatin1String("zip")}};

    py_other = {{('i'), QLatin1String("import")}};
}